

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O1

char GetBestLacingType(matroska_block *Element,int ForProfile)

{
  uint *puVar1;
  ebml_master *peVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ebml_context *peVar7;
  ebml_master *peVar8;
  ebml_integer *peVar9;
  int64_t iVar10;
  ulong uVar11;
  filepos_t fVar12;
  MatroskaTrackEncodingCompAlgo CompAlgo;
  ulong uVar13;
  ulong uVar14;
  size_t sVar15;
  MatroskaContentEncodingScope CompScope;
  int iVar16;
  uint uVar17;
  int iVar18;
  
  uVar6 = (Element->SizeList)._Used;
  if (uVar6 < 8) {
    return '\0';
  }
  puVar1 = (uint *)(Element->SizeList)._Begin;
  uVar5 = *puVar1;
  uVar11 = (ulong)uVar5;
  uVar6 = uVar6 >> 2;
  uVar13 = 1;
  do {
    uVar14 = uVar13;
    if (puVar1[uVar13] != uVar5) break;
    uVar13 = uVar13 + 1;
    uVar14 = uVar6;
  } while (uVar6 != uVar13);
  if (uVar14 == uVar6) {
    return '\x02';
  }
  peVar8 = Element->WriteTrack;
  if (peVar8 == (ebml_master *)0x0) {
    __assert_fail("Element->WriteTrack!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x662,"char GetBestLacingType(const matroska_block *, int)");
  }
  peVar7 = MATROSKA_getContextContentEncodings();
  iVar16 = 0;
  peVar8 = (ebml_master *)EBML_MasterFindFirstElt(peVar8,peVar7,0,0,0);
  CompScope = MATROSKA_CONTENTENCODINGSCOPE_BLOCK;
  CompAlgo = MATROSKA_TRACK_ENCODING_COMP_NONE;
  if (peVar8 == (ebml_master *)0x0) {
    peVar9 = (ebml_integer *)0x0;
  }
  else {
    peVar7 = MATROSKA_getContextContentEncoding();
    peVar8 = (ebml_master *)EBML_MasterFindFirstElt(peVar8,peVar7,0,0,0);
    peVar9 = (ebml_integer *)0x0;
    CompAlgo = MATROSKA_TRACK_ENCODING_COMP_NONE;
    if ((peVar8->Base).Base.Children != (nodetree *)0x0) {
      peVar2 = (ebml_master *)(peVar8->Base).Base.Next;
      if (peVar8 == peVar2) {
        __assert_fail("(nodetree*)(Elt) != ((nodetree*)(Elt))->Next",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                      ,0x669,"char GetBestLacingType(const matroska_block *, int)");
      }
      if (peVar2 == (ebml_master *)0x0) {
        peVar7 = MATROSKA_getContextContentEncodingScope();
        peVar9 = (ebml_integer *)EBML_MasterFindFirstElt(peVar8,peVar7,0,0,0);
        if (peVar9 == (ebml_integer *)0x0) {
          CompScope = MATROSKA_CONTENTENCODINGSCOPE_BLOCK;
        }
        else {
          iVar10 = EBML_IntegerValue(peVar9);
          CompScope = (MatroskaContentEncodingScope)iVar10;
        }
        peVar7 = MATROSKA_getContextContentCompression();
        peVar8 = (ebml_master *)EBML_MasterFindFirstElt(peVar8,peVar7,0,0,0);
        if (peVar8 == (ebml_master *)0x0) {
          return '\0';
        }
        peVar7 = MATROSKA_getContextContentCompAlgo();
        peVar9 = (ebml_integer *)EBML_MasterFindFirstElt(peVar8,peVar7,1,1,ForProfile);
        if (peVar9 == (ebml_integer *)0x0) {
          CompAlgo = MATROSKA_TRACK_ENCODING_COMP_NONE;
        }
        else {
          iVar10 = EBML_IntegerValue(peVar9);
          CompAlgo = (MatroskaTrackEncodingCompAlgo)iVar10;
        }
        if (((CompAlgo == MATROSKA_TRACK_ENCODING_COMP_HEADERSTRIP) ||
            (CompAlgo == MATROSKA_TRACK_ENCODING_COMP_ZLIB)) &&
           (iVar10 = EBML_IntegerValue(peVar9), iVar10 == 3)) {
          peVar7 = MATROSKA_getContextContentCompSettings();
          peVar9 = (ebml_integer *)EBML_MasterFindFirstElt(peVar8,peVar7,0,0,0);
        }
        if ((CompAlgo == MATROSKA_TRACK_ENCODING_COMP_HEADERSTRIP) ||
           (CompAlgo == MATROSKA_TRACK_ENCODING_COMP_ZLIB)) goto LAB_0010f7db;
      }
      return '\0';
    }
  }
LAB_0010f7db:
  if (((Element->SizeList)._Used & 0xfffffffffffffffc) != 4) {
    sVar15 = 0;
    iVar16 = 0;
    do {
      uVar11 = GetBlockFrameSize(Element,sVar15,&peVar9->Base,CompAlgo,CompScope);
      iVar18 = (int)uVar11;
      if (0xfe < iVar18) {
        iVar4 = 0x1fd;
        if (iVar18 < 0x1fd) {
          iVar4 = iVar18;
        }
        uVar5 = (iVar18 - iVar4) + 0xfe;
        uVar17 = uVar5 / 0xff;
        iVar16 = iVar16 + uVar17 + 1;
        uVar11 = (ulong)((iVar18 + uVar17 + (uVar5 / 0xff) * -0x100) - 0xff);
      }
      iVar16 = iVar16 + 1;
      sVar15 = sVar15 + 1;
    } while (sVar15 < ((Element->SizeList)._Used >> 2) - 1);
  }
  fVar12 = GetBlockFrameSize(Element,0,&peVar9->Base,CompAlgo,CompScope);
  sVar15 = 1;
  bVar3 = EBML_CodedSizeLength(fVar12,'\0',1);
  uVar5 = (uint)bVar3;
  if (((Element->SizeList)._Used >> 2) - 3 < 0xfffffffffffffffe) {
    do {
      fVar12 = GetBlockFrameSize(Element,sVar15,&peVar9->Base,CompAlgo,CompScope);
      uVar17 = (int)fVar12 - (int)uVar11;
      bVar3 = EBML_CodedSizeLengthSigned((long)(int)uVar17,'\0');
      uVar5 = uVar5 + bVar3;
      sVar15 = sVar15 + 1;
      uVar11 = (ulong)uVar17;
    } while (sVar15 < ((Element->SizeList)._Used >> 2) - 1);
  }
  return ((int)uVar5 <= iVar16) * '\x02' + '\x01';
}

Assistant:

static char GetBestLacingType(const matroska_block *Element, int ForProfile)
{
    int XiphLacingSize, EbmlLacingSize;
    size_t i;
    int32_t DataSize;
    ebml_element *Elt, *Elt2, *Header = NULL;
    MatroskaTrackEncodingCompAlgo CompressionAlgo = MATROSKA_TRACK_ENCODING_COMP_NONE;
    MatroskaContentEncodingScope CompressionScope = MATROSKA_CONTENTENCODINGSCOPE_BLOCK;

    if (ARRAYCOUNT(Element->SizeList,int32_t) <= 1)
        return LACING_NONE;

    DataSize = ARRAYBEGIN(Element->SizeList,int32_t)[0];
    for (i=1;i<ARRAYCOUNT(Element->SizeList,int32_t);++i)
    {
        if (ARRAYBEGIN(Element->SizeList,int32_t)[i]!=DataSize)
            break;
    }
    if (i==ARRAYCOUNT(Element->SizeList,int32_t))
        return LACING_FIXED;

    // find out if compressed headers are used
    assert(Element->WriteTrack!=NULL);
    Elt = EBML_MasterFindChild(Element->WriteTrack, MATROSKA_getContextContentEncodings());
    if (Elt)
    {
        Elt = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentEncoding());
        if (EBML_MasterChildren(Elt))
        {
            if (EBML_MasterNext(Elt))
                return 0; // TODO support cascaded compression/encryption

            Elt2 = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentEncodingScope());
            if (Elt2)
                CompressionScope = EBML_IntegerValue((ebml_integer*)Elt2);

            Elt = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentCompression());
            if (!Elt)
                return 0; // TODO: support encryption

            Header = EBML_MasterGetChild((ebml_master*)Elt, MATROSKA_getContextContentCompAlgo(),ForProfile);
            if (Header)
                CompressionAlgo = EBML_IntegerValue((ebml_integer*)Header);
            bool_t CanCompress = 0;
            if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_HEADERSTRIP)
                CanCompress = 1;
#if defined(CONFIG_ZLIB)
            else if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_ZLIB)
                CanCompress = 1;
#endif
            if (!CanCompress)
                return 0;

            if (EBML_IntegerValue((ebml_integer*)Header)==MATROSKA_TRACK_ENCODING_COMP_HEADERSTRIP)
                Header = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentCompSettings());
        }
    }

    XiphLacingSize = 0;
    for (i=0;i<ARRAYCOUNT(Element->SizeList,int32_t)-1;++i)
    {
        DataSize = (int32_t)GetBlockFrameSize(Element, i, Header, CompressionAlgo, CompressionScope);
        while (DataSize >= 0xFF)
        {
            XiphLacingSize++;
            DataSize -= 0xFF;
        }
        XiphLacingSize++;
    }

    EbmlLacingSize = EBML_CodedSizeLength(GetBlockFrameSize(Element, 0, Header, CompressionAlgo, CompressionScope),0,1);
    for (i=1;i<ARRAYCOUNT(Element->SizeList,int32_t)-1;++i)
    {
        DataSize = (int32_t)GetBlockFrameSize(Element, i, Header, CompressionAlgo, CompressionScope) - DataSize;
        EbmlLacingSize += EBML_CodedSizeLengthSigned(DataSize,0);
    }

    if (XiphLacingSize < EbmlLacingSize)
        return LACING_XIPH;
    else
        return LACING_EBML;
}